

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_err_t linear_hash_init(ion_dictionary_id_t id,ion_dictionary_size_t dictionary_size,
                          ion_key_type_t key_type,ion_key_size_t key_size,
                          ion_value_size_t value_size,int initial_size,int split_threshold,
                          int records_per_bucket,linear_hash_table_t *linear_hash)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  ion_err_t iVar4;
  ion_byte_t *piVar5;
  array_list_t *paVar6;
  ion_fpos_t *piVar7;
  FILE *pFVar8;
  int idx;
  char acStack_38 [12];
  char local_2c [12];
  
  (linear_hash->super).id = id;
  linear_hash->dictionary_size = dictionary_size;
  (linear_hash->super).key_type = key_type;
  (linear_hash->super).record.key_size = key_size;
  (linear_hash->super).record.value_size = value_size;
  linear_hash->initial_size = initial_size;
  linear_hash->num_buckets = initial_size;
  linear_hash->num_records = 0;
  linear_hash->next_split = 0;
  linear_hash->split_threshold = split_threshold;
  linear_hash->records_per_bucket = records_per_bucket;
  linear_hash->record_total_size = (long)(value_size + key_size) + 1;
  piVar5 = (ion_byte_t *)malloc(0x80);
  linear_hash->cache = piVar5;
  dictionary_get_filename(id,"lhd",local_2c);
  dictionary_get_filename((linear_hash->super).id,"lhs",acStack_38);
  paVar6 = (array_list_t *)malloc(0x10);
  if (paVar6 != (array_list_t *)0x0) {
    paVar6->current_size = 5;
    piVar7 = (ion_fpos_t *)malloc(0x28);
    paVar6->data = piVar7;
    *piVar7 = 0;
    piVar7[1] = 0;
    piVar7[2] = 0;
    piVar7[3] = 0;
    piVar7[4] = 0;
    if (piVar7 != (ion_fpos_t *)0x0) {
      linear_hash->bucket_map = paVar6;
      pFVar8 = fopen(local_2c,"r+b");
      linear_hash->database = (FILE *)pFVar8;
      if (pFVar8 == (FILE *)0x0) {
        pFVar8 = fopen(local_2c,"w+b");
        linear_hash->database = (FILE *)pFVar8;
        if (pFVar8 == (FILE *)0x0) {
          return '\t';
        }
        bVar1 = 0 < linear_hash->initial_size;
        if (0 < linear_hash->initial_size) {
          bVar3 = write_new_bucket(0,linear_hash);
          if (bVar3 == 0) {
            idx = 1;
            do {
              bVar1 = idx < linear_hash->initial_size;
              if (linear_hash->initial_size <= idx) goto LAB_0010b493;
              bVar3 = write_new_bucket(idx,linear_hash);
              idx = idx + 1;
            } while (bVar3 == 0);
          }
          id = (ion_dictionary_id_t)bVar3;
          linear_hash_close(linear_hash);
        }
LAB_0010b493:
        if (bVar1) {
          return (ion_err_t)id;
        }
      }
      pFVar8 = fopen(acStack_38,"r+b");
      linear_hash->state = (FILE *)pFVar8;
      if (pFVar8 == (FILE *)0x0) {
        pFVar8 = fopen(acStack_38,"w+b");
        linear_hash->state = (FILE *)pFVar8;
        if (pFVar8 == (FILE *)0x0) {
          return '\t';
        }
        cVar2 = linear_hash_write_state(linear_hash);
      }
      else {
        cVar2 = linear_hash_read_state(linear_hash);
      }
      if (cVar2 == '\0') {
        iVar4 = linear_hash_write_state(linear_hash);
        return iVar4;
      }
      return cVar2;
    }
  }
  linear_hash_close(linear_hash);
  return '\x06';
}

Assistant:

ion_err_t
linear_hash_init(
	ion_dictionary_id_t		id,
	ion_dictionary_size_t	dictionary_size,
	ion_key_type_t			key_type,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	int						initial_size,
	int						split_threshold,
	int						records_per_bucket,
	linear_hash_table_t		*linear_hash
) {
	/* err */
	ion_err_t err;

	/* parameter not used */
	linear_hash->super.id					= id;
	linear_hash->dictionary_size			= dictionary_size;
	linear_hash->super.key_type				= key_type;
	linear_hash->super.record.key_size		= key_size;
	linear_hash->super.record.value_size	= value_size;

	/* initialize linear_hash fields */
	linear_hash->initial_size				= initial_size;
	linear_hash->num_buckets				= initial_size;
	linear_hash->num_records				= 0;
	linear_hash->next_split					= 0;
	linear_hash->split_threshold			= split_threshold;
	linear_hash->records_per_bucket			= records_per_bucket;
	linear_hash->record_total_size			= key_size + value_size + sizeof(ion_byte_t);
	linear_hash->cache						= malloc(128);

	char data_filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(linear_hash->super.id, "lhd", data_filename);

	char state_filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(linear_hash->super.id, "lhs", state_filename);

	/* mapping of buckets to file offsets */
	array_list_t *bucket_map;

	bucket_map = malloc(sizeof(array_list_t));

	if (NULL == bucket_map) {
		/* clean up resources before returning if out of memory */
		linear_hash_close(linear_hash);
		return err_out_of_memory;
	}

	err = array_list_init(5, bucket_map);

	if (err != err_ok) {
		/* clean up resources before returning if out of memory */
		linear_hash_close(linear_hash);
		return err;
	}

	linear_hash->bucket_map = bucket_map;
	linear_hash->database	= fopen(data_filename, "r+b");

	if (NULL == linear_hash->database) {
		linear_hash->database = fopen(data_filename, "w+b");

		if (NULL == linear_hash->database) {
			return err_file_open_error;
		}

		int i;

		for (i = 0; i < linear_hash->initial_size; i++) {
			err = write_new_bucket(i, linear_hash);

			if (err != err_ok) {
				linear_hash_close(linear_hash);
				return err;
			}
		}
	}

	linear_hash->state = fopen(state_filename, "r+b");

	if (NULL == linear_hash->state) {
		linear_hash->state = fopen(state_filename, "w+b");

		if (NULL == linear_hash->state) {
			return err_file_open_error;
		}

		err = linear_hash_write_state(linear_hash);

		if (err != err_ok) {
			return err;
		}
	}
	else {
		err = linear_hash_read_state(linear_hash);

		if (err != err_ok) {
			return err;
		}
	}

	err = linear_hash_write_state(linear_hash);

	if (err != err_ok) {
		return err;
	}

	/* return pointer to the linear_hash that is sitting in memory */
	return err_ok;
}